

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O2

wchar_t lzx_read_bitlen(lzx_stream *strm,huffman *d,wchar_t end)

{
  lzx_br *br;
  byte bVar1;
  ushort uVar2;
  lzx_dec *plVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  uchar *puVar9;
  ulong uVar10;
  wchar_t wVar11;
  long lVar12;
  wchar_t wVar13;
  bool bVar14;
  
  plVar3 = strm->ds;
  wVar13 = plVar3->loop;
  if (wVar13 == L'\0') {
    d->freq[0xc] = L'\0';
    d->freq[0xd] = L'\0';
    d->freq[0xe] = L'\0';
    d->freq[0xf] = L'\0';
    d->freq[8] = L'\0';
    d->freq[9] = L'\0';
    d->freq[10] = L'\0';
    d->freq[0xb] = L'\0';
    d->freq[4] = L'\0';
    d->freq[5] = L'\0';
    d->freq[6] = L'\0';
    d->freq[7] = L'\0';
    d->freq[0] = L'\0';
    d->freq[1] = L'\0';
    d->freq[2] = L'\0';
    d->freq[3] = L'\0';
    d->freq[0x10] = L'\0';
  }
  if (end < L'\0') {
    end = d->len_size;
  }
  br = &plVar3->br;
  do {
    if (end <= wVar13) {
      wVar5 = L'\x01';
LAB_0031ab1f:
      plVar3->loop = wVar13;
      return wVar5;
    }
    plVar3->loop = wVar13;
    wVar5 = (plVar3->br).cache_avail;
    wVar11 = (plVar3->pt).max_bits;
    if (wVar5 < wVar11) {
      wVar4 = lzx_br_fillup(strm,br);
      wVar5 = (plVar3->br).cache_avail;
      wVar11 = (plVar3->pt).max_bits;
      if (wVar4 != L'\0' || wVar11 <= wVar5) goto LAB_0031a86f;
LAB_0031ab1d:
      wVar5 = L'\0';
      goto LAB_0031ab1f;
    }
LAB_0031a86f:
    uVar2 = (plVar3->pt).tbl
            [(uint)((plVar3->br).cache_buffer >> ((char)wVar5 - (char)wVar11 & 0x3fU)) &
             cache_masks[wVar11]];
    uVar7 = (uint)uVar2;
    if ((plVar3->pt).len_size <= (int)(uint)uVar2) {
      uVar7 = 0;
    }
    puVar9 = (plVar3->pt).bitlen;
    if (uVar7 == 0x13) {
      uVar7 = (uint)puVar9[0x13];
      if (wVar5 < wVar11 + (uint)puVar9[0x13] + L'\x01') {
        wVar5 = lzx_br_fillup(strm,br);
        puVar9 = (plVar3->pt).bitlen;
        if (wVar5 == L'\0') {
          wVar5 = (plVar3->br).cache_avail;
          uVar7 = (uint)puVar9[0x13];
          if (wVar5 < (plVar3->pt).max_bits + (uint)puVar9[0x13] + L'\x01') goto LAB_0031ab1d;
        }
        else {
          uVar7 = (uint)puVar9[0x13];
          wVar5 = (plVar3->br).cache_avail;
        }
      }
      (plVar3->br).cache_avail = wVar5 - uVar7;
      uVar10 = (plVar3->br).cache_buffer;
      wVar5 = (wVar5 - uVar7) + L'\xffffffff';
      bVar14 = (uVar10 >> ((ulong)(uint)wVar5 & 0x3f) & 1) != 0;
      if (end < (uint)bVar14 + wVar13 + L'\x04') {
        return L'\xffffffff';
      }
      (plVar3->br).cache_avail = wVar5;
      wVar11 = (plVar3->pt).max_bits;
      uVar2 = (plVar3->pt).tbl
              [(uint)(uVar10 >> ((char)wVar5 - (char)wVar11 & 0x3fU)) & cache_masks[wVar11]];
      uVar10 = (ulong)uVar2;
      if ((plVar3->pt).len_size <= (int)(uint)uVar2) {
        uVar10 = 0;
      }
      (plVar3->br).cache_avail = wVar5 - (uint)puVar9[uVar10];
      lVar12 = (long)wVar13;
      uVar10 = (long)(int)(((uint)d->bitlen[lVar12] - (int)uVar10) + 0x11) % 0x11;
      uVar8 = uVar10 & 0xffffffff;
      if ((int)uVar10 < 0) {
        return L'\xffffffff';
      }
      uVar7 = (uint)bVar14;
      for (iVar6 = 0; -4 - uVar7 != iVar6; iVar6 = iVar6 + -1) {
        d->bitlen[lVar12] = (uchar)uVar8;
        lVar12 = lVar12 + 1;
      }
      wVar13 = wVar13 - iVar6;
      d->freq[uVar8] = d->freq[uVar8] + (uVar7 | 4);
    }
    else if (uVar7 == 0x12) {
      uVar7 = (uint)puVar9[0x12];
      if (wVar5 < (uint)puVar9[0x12] + L'\x05') {
        wVar5 = lzx_br_fillup(strm,br);
        puVar9 = (plVar3->pt).bitlen;
        if (wVar5 == L'\0') {
          wVar5 = (plVar3->br).cache_avail;
          bVar1 = puVar9[0x12];
          uVar7 = (uint)bVar1;
          if (wVar5 < (uint)bVar1 + L'\x05') goto LAB_0031ab1d;
        }
        else {
          uVar7 = (uint)puVar9[0x12];
          wVar5 = (plVar3->br).cache_avail;
        }
      }
      (plVar3->br).cache_avail = wVar5 - uVar7;
      wVar5 = (wVar5 - uVar7) + L'\xfffffffb';
      uVar7 = (uint)((plVar3->br).cache_buffer >> ((byte)wVar5 & 0x3f)) & 0x1f;
      wVar11 = uVar7 + wVar13 + L'\x14';
      if (end < wVar11) {
        return L'\xffffffff';
      }
      (plVar3->br).cache_avail = wVar5;
      memset(d->bitlen + wVar13,0,(ulong)(uVar7 + 0x14));
      wVar13 = wVar11;
    }
    else {
      lVar12 = (long)wVar13;
      if (uVar7 == 0x11) {
        uVar7 = (uint)puVar9[0x11];
        if (wVar5 < (uint)puVar9[0x11] + L'\x04') {
          wVar5 = lzx_br_fillup(strm,br);
          puVar9 = (plVar3->pt).bitlen;
          if (wVar5 == L'\0') {
            wVar5 = (plVar3->br).cache_avail;
            bVar1 = puVar9[0x11];
            uVar7 = (uint)bVar1;
            if (wVar5 < (uint)bVar1 + L'\x04') goto LAB_0031ab1d;
          }
          else {
            uVar7 = (uint)puVar9[0x11];
            wVar5 = (plVar3->br).cache_avail;
          }
        }
        (plVar3->br).cache_avail = wVar5 - uVar7;
        wVar5 = (wVar5 - uVar7) + L'\xfffffffc';
        uVar7 = (uint)((plVar3->br).cache_buffer >> ((byte)wVar5 & 0x3f)) & 0xf;
        if (end < uVar7 + wVar13 + L'\x04') {
          return L'\xffffffff';
        }
        (plVar3->br).cache_avail = wVar5;
        for (iVar6 = 0; -4 - uVar7 != iVar6; iVar6 = iVar6 + -1) {
          d->bitlen[lVar12] = '\0';
          lVar12 = lVar12 + 1;
        }
        wVar13 = wVar13 - iVar6;
      }
      else {
        (plVar3->br).cache_avail = wVar5 - (uint)puVar9[uVar7];
        puVar9 = d->bitlen;
        uVar10 = (long)(int)((puVar9[lVar12] - uVar7) + 0x11) % 0x11;
        uVar8 = uVar10 & 0xffffffff;
        if ((int)uVar10 < 0) {
          return L'\xffffffff';
        }
        d->freq[uVar8] = d->freq[uVar8] + L'\x01';
        puVar9[lVar12] = (uchar)uVar8;
        wVar13 = wVar13 + L'\x01';
      }
    }
  } while( true );
}

Assistant:

static int
lzx_read_bitlen(struct lzx_stream *strm, struct huffman *d, int end)
{
	struct lzx_dec *ds = strm->ds;
	struct lzx_br *br = &(ds->br);
	int c, i, j, ret, same;
	unsigned rbits;

	i = ds->loop;
	if (i == 0)
		memset(d->freq, 0, sizeof(d->freq));
	ret = 0;
	if (end < 0)
		end = d->len_size;
	while (i < end) {
		ds->loop = i;
		if (!lzx_br_read_ahead(strm, br, ds->pt.max_bits))
			goto getdata;
		rbits = lzx_br_bits(br, ds->pt.max_bits);
		c = lzx_decode_huffman(&(ds->pt), rbits);
		switch (c) {
		case 17:/* several zero lengths, from 4 to 19. */
			if (!lzx_br_read_ahead(strm, br, ds->pt.bitlen[c]+4))
				goto getdata;
			lzx_br_consume(br, ds->pt.bitlen[c]);
			same = lzx_br_bits(br, 4) + 4;
			if (i + same > end)
				return (-1);/* Invalid */
			lzx_br_consume(br, 4);
			for (j = 0; j < same; j++)
				d->bitlen[i++] = 0;
			break;
		case 18:/* many zero lengths, from 20 to 51. */
			if (!lzx_br_read_ahead(strm, br, ds->pt.bitlen[c]+5))
				goto getdata;
			lzx_br_consume(br, ds->pt.bitlen[c]);
			same = lzx_br_bits(br, 5) + 20;
			if (i + same > end)
				return (-1);/* Invalid */
			lzx_br_consume(br, 5);
			memset(d->bitlen + i, 0, same);
			i += same;
			break;
		case 19:/* a few same lengths. */
			if (!lzx_br_read_ahead(strm, br,
			    ds->pt.bitlen[c]+1+ds->pt.max_bits))
				goto getdata;
			lzx_br_consume(br, ds->pt.bitlen[c]);
			same = lzx_br_bits(br, 1) + 4;
			if (i + same > end)
				return (-1);
			lzx_br_consume(br, 1);
			rbits = lzx_br_bits(br, ds->pt.max_bits);
			c = lzx_decode_huffman(&(ds->pt), rbits);
			lzx_br_consume(br, ds->pt.bitlen[c]);
			c = (d->bitlen[i] - c + 17) % 17;
			if (c < 0)
				return (-1);/* Invalid */
			for (j = 0; j < same; j++)
				d->bitlen[i++] = c;
			d->freq[c] += same;
			break;
		default:
			lzx_br_consume(br, ds->pt.bitlen[c]);
			c = (d->bitlen[i] - c + 17) % 17;
			if (c < 0)
				return (-1);/* Invalid */
			d->freq[c]++;
			d->bitlen[i++] = c;
			break;
		}
	}
	ret = 1;
getdata:
	ds->loop = i;
	return (ret);
}